

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O2

int __thiscall cmCursesMainForm::Generate(cmCursesMainForm *this)

{
  bool bVar1;
  int iVar2;
  cmCursesLongMessageForm *this_00;
  ulong uVar3;
  ulong uVar4;
  char *title;
  uint uVar5;
  uint uVar6;
  allocator<char> local_99;
  string local_98;
  _Any_data local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  ResetOutputs(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"Generating",&local_99);
  UpdateProgress(this,&local_98,0.0);
  std::__cxx11::string::~string((string *)&local_98);
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CursesDialog/cmCursesMainForm.cxx:538:5)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CursesDialog/cmCursesMainForm.cxx:538:5)>
             ::_M_manager;
  local_50._M_unused._M_object = this;
  cmake::SetProgressCallback
            ((this->CMakeInstance)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>.
             _M_t.super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
             super__Head_base<0UL,_cmake_*,_false>._M_head_impl,(ProgressCallbackType *)&local_50);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  iVar2 = cmake::Generate((this->CMakeInstance)._M_t.
                          super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
                          super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
                          super__Head_base<0UL,_cmake_*,_false>._M_head_impl);
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = 0;
  uStack_60 = 0;
  cmake::SetProgressCallback
            ((this->CMakeInstance)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>.
             _M_t.super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
             super__Head_base<0UL,_cmake_*,_false>._M_head_impl,(ProgressCallbackType *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  keypad(_stdscr,1);
  if ((iVar2 != 0) || (this->HasNonStatusOutputs == true)) {
    bVar1 = cmSystemTools::GetErrorOccurredFlag();
    if (bVar1) {
      this->OkToGenerate = false;
    }
    cmSystemTools::s_FatalErrorOccurred = false;
    cmSystemTools::s_ErrorOccurred = false;
    if (_stdscr == 0) {
      uVar5 = 0xffffffff;
      uVar6 = 0xffffffff;
    }
    else {
      uVar5 = (int)*(short *)(_stdscr + 4) + 1;
      uVar6 = (int)*(short *)(_stdscr + 6) + 1;
    }
    bVar1 = cmSystemTools::GetErrorOccurredFlag();
    title = "Generate produced the following output";
    if (bVar1) {
      title = "Generate failed with the following output";
    }
    this_00 = (cmCursesLongMessageForm *)operator_new(0x68);
    cmCursesLongMessageForm::cmCursesLongMessageForm(this_00,&this->Outputs,title,ScrollDown);
    cmCursesForm::CurrentForm = (cmCursesForm *)this_00;
    (*(this_00->super_cmCursesForm)._vptr_cmCursesForm[3])(this_00,1,1,(ulong)uVar6,(ulong)uVar5);
    (*(this_00->super_cmCursesForm)._vptr_cmCursesForm[2])(this_00);
    if (iVar2 == -2) {
      return -2;
    }
  }
  InitializeUI(this);
  if (_stdscr == 0) {
    uVar4 = 0xffffffffffffffff;
    uVar3 = 0xffffffff;
  }
  else {
    uVar4 = (ulong)((int)*(short *)(_stdscr + 4) + 1);
    uVar3 = (ulong)((int)*(short *)(_stdscr + 6) + 1);
  }
  cmCursesForm::CurrentForm = &this->super_cmCursesForm;
  (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])(this,1,1,uVar3,uVar4);
  return 0;
}

Assistant:

int cmCursesMainForm::Generate()
{
  this->ResetOutputs();

  this->UpdateProgress("Generating", 0);
  this->CMakeInstance->SetProgressCallback(
    [this](const std::string& msg, float prog) {
      this->UpdateProgress(msg, prog);
    });

  // run the generate process
  int retVal = this->CMakeInstance->Generate();

  this->CMakeInstance->SetProgressCallback(nullptr);
  keypad(stdscr, true); /* Use key symbols as KEY_DOWN */

  if (retVal != 0 || this->HasNonStatusOutputs) {
    // see if there was an error
    if (cmSystemTools::GetErrorOccurredFlag()) {
      this->OkToGenerate = false;
    }
    // reset error condition
    cmSystemTools::ResetErrorOccurredFlag();
    int xx;
    int yy;
    getmaxyx(stdscr, yy, xx);
    const char* title = "Generate produced the following output";
    if (cmSystemTools::GetErrorOccurredFlag()) {
      title = "Generate failed with the following output";
    }
    cmCursesLongMessageForm* msgs = new cmCursesLongMessageForm(
      this->Outputs, title,
      cmCursesLongMessageForm::ScrollBehavior::ScrollDown);
    CurrentForm = msgs;
    msgs->Render(1, 1, xx, yy);
    msgs->HandleInput();
    // If they typed the wrong source directory, we report
    // an error and exit
    if (retVal == -2) {
      return retVal;
    }
  }

  this->InitializeUI();
  CurrentForm = this;
  int xi;
  int yi;
  getmaxyx(stdscr, yi, xi);
  this->Render(1, 1, xi, yi);

  return 0;
}